

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool parseCmakeBoolean(QJsonValue *value)

{
  int iVar1;
  bool *in_RDI;
  long in_FS_OFFSET;
  QString stringValue;
  byte bVar2;
  uint base;
  undefined2 uVar4;
  undefined4 uVar3;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  QByteArrayView *in_stack_ffffffffffffff40;
  undefined1 local_b0 [40];
  undefined1 local_88 [40];
  undefined1 local_60 [40];
  undefined1 local_38 [24];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QJsonValue::toString();
  QByteArrayView::QByteArrayView<5ul>
            (in_stack_ffffffffffffff40,
             (char (*) [5])CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  QString::fromUtf8((QByteArrayView *)local_38);
  iVar1 = QString::compare((QString *)&local_20,(CaseSensitivity)local_38);
  base = 1;
  if (iVar1 == 0) {
    QByteArrayView::QByteArrayView<3ul>
              (in_stack_ffffffffffffff40,
               (char (*) [3])CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    QString::fromUtf8((QByteArrayView *)local_60);
    uVar3 = CONCAT13(1,(int3)base);
    iVar1 = QString::compare((QString *)&local_20,(CaseSensitivity)local_60);
    base = CONCAT31((int3)((uint)uVar3 >> 8),1);
    if (iVar1 == 0) {
      QByteArrayView::QByteArrayView<4ul>
                (in_stack_ffffffffffffff40,
                 (char (*) [4])CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
      QString::fromUtf8((QByteArrayView *)local_88);
      uVar3 = CONCAT13((char)(base >> 0x18),CONCAT12(1,(short)base));
      iVar1 = QString::compare((QString *)&local_20,(CaseSensitivity)local_88);
      base = CONCAT31((int3)((uint)uVar3 >> 8),1);
      if (iVar1 == 0) {
        QByteArrayView::QByteArrayView<2ul>
                  (in_stack_ffffffffffffff40,
                   (char (*) [2])CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
        uVar4 = (undefined2)(base >> 0x10);
        QString::fromUtf8((QByteArrayView *)local_b0);
        uVar3 = CONCAT22(uVar4,0x100);
        iVar1 = QString::compare((QString *)&local_20,(CaseSensitivity)local_b0);
        base = CONCAT31((int3)((uint)uVar3 >> 8),1);
        if (iVar1 == 0) {
          iVar1 = QString::toInt((QString *)
                                 CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                                 in_RDI,base);
          base = CONCAT31((int3)(base >> 8),0 < iVar1);
        }
      }
    }
  }
  bVar2 = (byte)base;
  if ((base & 0x100) != 0) {
    QString::~QString((QString *)0x10fc4a);
  }
  if ((base & 0x10000) != 0) {
    QString::~QString((QString *)0x10fc5d);
  }
  if ((base & 0x1000000) != 0) {
    QString::~QString((QString *)0x10fc70);
  }
  QString::~QString((QString *)0x10fc7d);
  QString::~QString((QString *)0x10fc8a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool parseCmakeBoolean(const QJsonValue &value)
{
    const QString stringValue = value.toString();
    return (stringValue.compare(QString::fromUtf8("true"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("on"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("yes"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("y"), Qt::CaseInsensitive)
                 || stringValue.toInt() > 0);
}